

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fwrite(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  undefined4 uStack_38;
  int nLen;
  
  _uStack_38 = in_RAX;
  if ((((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (plVar1 = (long *)((*apArg)->x).pOther, plVar1 == (long *)0x0)) ||
     (*(int *)((long)plVar1 + 0x34) != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  }
  else {
    puVar2 = (undefined8 *)*plVar1;
    if (puVar2 == (undefined8 *)0x0) {
      pcVar5 = "null_stream";
    }
    else {
      if (puVar2[8] != 0) {
        pcVar5 = jx9_value_to_string(apArg[1],&nLen);
        if (nArg == 2) {
          iVar4 = nLen;
        }
        else {
          iVar3 = jx9_value_to_int(apArg[2]);
          iVar4 = nLen;
          if (iVar3 < nLen && -1 < iVar3) {
            _uStack_38 = CONCAT44(iVar3,uStack_38);
            iVar4 = iVar3;
          }
        }
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        else {
          iVar4 = (*(code *)puVar2[8])(plVar1[1],pcVar5,iVar4);
          if (iVar4 < 0) goto LAB_001363ca;
        }
        jx9_result_int(pCtx,iVar4);
        return 0;
      }
      pcVar5 = (char *)*puVar2;
    }
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,pcVar5);
  }
LAB_001363ca:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_fwrite(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zString;
	io_private *pDev;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/* Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xWrite == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the data to write */
	zString = jx9_value_to_string(apArg[1], &nLen);
	if( nArg > 2 ){
		/* Maximum data length to write */
		n = jx9_value_to_int(apArg[2]);
		if( n >= 0 && n < nLen ){
			nLen = n;
		}
	}
	if( nLen < 1 ){
		/* Nothing to write */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	n = (int)pStream->xWrite(pDev->pHandle, (const void *)zString, nLen);
	if( n <  0 ){
		/* IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* #Bytes written */
		jx9_result_int(pCtx, n);
	}
	return JX9_OK;
}